

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O3

int cmpfortree(void *av,void *bv)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (((*(int *)((long)bv + 8) <= *(int *)((long)av + 8)) &&
      (uVar1 = 1, *(int *)((long)av + 8) <= *(int *)((long)bv + 8))) &&
     (uVar1 = 0xffffffff, bv <= av)) {
    uVar1 = (uint)(bv < av);
  }
  return uVar1;
}

Assistant:

static int cmpfortree(void *av, void *bv)
{
    NetSocket *a = (NetSocket *) av, *b = (NetSocket *) bv;
    int as = a->s, bs = b->s;
    if (as < bs)
        return -1;
    if (as > bs)
        return +1;
    if (a < b)
       return -1;
    if (a > b)
       return +1;
    return 0;
}